

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O2

void __thiscall
SubcommandProgram_MultipleArgs_Test::TestBody(SubcommandProgram_MultipleArgs_Test *this)

{
  char *message;
  long lVar1;
  AssertHelper local_78;
  AssertionResult gtest_ar;
  _Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_> local_60;
  string local_40 [32];
  unsigned_long local_20;
  
  std::__cxx11::string::string((string *)&local_60,"start",(allocator *)&gtest_ar);
  std::__cxx11::string::string(local_40,"stop",(allocator *)&local_78);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &(this->super_SubcommandProgram).super_TApp.args,&local_60,&local_20);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string
              ((string *)((long)&local_60._M_impl.super__Vector_impl_data._M_start + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  TApp::run((TApp *)this);
  local_78.data_ = (AssertHelperData *)0x2;
  CLI::App::get_subcommands
            ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)&local_60,
             &(this->super_SubcommandProgram).super_TApp.app,true);
  local_20 = (long)local_60._M_impl.super__Vector_impl_data._M_finish -
             (long)local_60._M_impl.super__Vector_impl_data._M_start >> 3;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"(size_t)2","app.get_subcommands().size()",
             (unsigned_long *)&local_78,&local_20);
  CLI::std::_Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>::~_Vector_base(&local_60);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_60);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x1e5,message);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_60);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(SubcommandProgram, MultipleArgs) {
    args = {"start", "stop"};

    run();

    EXPECT_EQ((size_t)2, app.get_subcommands().size());
}